

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FieldDescriptor::FieldTypeNameDebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  byte bVar1;
  EnumDescriptor *pEVar2;
  Descriptor *pDVar3;
  char *pcVar4;
  string_view local_78 [3];
  AlphaNum local_48;
  
  bVar1 = this->type_;
  if (bVar1 - 10 < 2) {
    if ((bVar1 != 10) || (999 < (int)this->file_->edition_)) {
      local_78[0] = absl::lts_20250127::NullSafeStringView(".");
      pDVar3 = message_type(this);
      pcVar4 = (pDVar3->all_names_).payload_;
LAB_00bf3011:
      local_48.piece_._M_len = (size_t)*(ushort *)(pcVar4 + 2);
      local_48.piece_._M_str = pcVar4 + ~local_48.piece_._M_len;
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)local_78,&local_48,
                 (AlphaNum *)local_48.piece_._M_str);
      return __return_storage_ptr__;
    }
    pcVar4 = "group";
  }
  else {
    if (bVar1 == 0xe) {
      local_78[0] = absl::lts_20250127::NullSafeStringView(".");
      pEVar2 = enum_type(this);
      pcVar4 = (pEVar2->all_names_).payload_;
      goto LAB_00bf3011;
    }
    pcVar4 = *(char **)(kTypeToName + (ulong)bVar1 * 8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar4,(allocator<char> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::FieldTypeNameDebugString() const {
  switch (type()) {
    case TYPE_MESSAGE:
    case TYPE_GROUP:
      if (IsGroupSyntax(file()->edition(), this)) {
        return kTypeToName[type()];
      }
      return absl::StrCat(".", message_type()->full_name());
    case TYPE_ENUM:
      return absl::StrCat(".", enum_type()->full_name());
    default:
      return kTypeToName[type()];
  }
}